

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lupica.c
# Opt level: O0

int main(int argc,char **argv)

{
  Result RVar1;
  StageResult SVar2;
  Emulator *e_00;
  int local_48;
  int i;
  StageResult sr;
  Emulator *e;
  Buffer rom;
  char *rom_filename;
  int result;
  char **argv_local;
  int argc_local;
  
  if (argc == 2) {
    rom.size = (size_t)argv[1];
    RVar1 = read_file((char *)rom.size,(Buffer *)&e);
    if (RVar1 == OK) {
      e_00 = (Emulator *)malloc(0x800f8);
      init_emulator(e_00,(Buffer *)&e);
      e_00->verbosity = 0;
      local_48 = 0;
      do {
        if (1499999 < local_48) {
LAB_001091ae:
          free(e_00);
          return 0;
        }
        SVar2 = step(e_00);
        if (SVar2 == STAGE_RESULT_UNIMPLEMENTED) {
          e_00->verbosity = 2;
          step(e_00);
          goto LAB_001091ae;
        }
        local_48 = local_48 + 1;
      } while( true );
    }
  }
  else {
    fprintf(_stderr,"%s:%d: ",
            "/workspace/llm4binary/github/license_c_cmakelists/binji[P]lupica/src/lupica.c",0x7b0);
    fprintf(_stderr,"no rom file given.\n");
  }
  return 1;
}

Assistant:

int main(int argc, char** argv) {
  --argc; ++argv;
  int result = 1;
  CHECK_MSG(argc == 1, "no rom file given.\n");
  const char* rom_filename = argv[0];

  Buffer rom;
  CHECK(SUCCESS(read_file(rom_filename, &rom)));
  Emulator* e = malloc(sizeof(Emulator));
  init_emulator(e, &rom);

  e->verbosity = 0;

  StageResult sr;
  int i;
  for (i = 0; i < 1500000; ++i) {
    sr = step(e);

    if (sr == STAGE_RESULT_UNIMPLEMENTED) {
      e->verbosity = 2;
      step(e);
      break;
    }
  }

  free(e);

  return 0;
  ON_ERROR_RETURN;
}